

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_attach(REF_GRID ref_grid)

{
  double *pdVar1;
  REF_GEOM pRVar2;
  REF_ADJ pRVar3;
  REF_DBL *pRVar4;
  REF_CELL pRVar5;
  REF_NODE pRVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  REF_ADJ_ITEM pRVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  undefined8 uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  REF_INT RVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong uStack_180;
  double local_168;
  int local_154;
  ulong local_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  double dStack_130;
  ulong local_120;
  REF_GRID local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  REF_FACELIFT ref_facelift;
  REF_GRID freeable_ref_grid;
  REF_DBL local_e8 [4];
  REF_DBL node_xyz [3];
  REF_INT nodes [27];
  
  uVar8 = ref_grid_deep_copy(&freeable_ref_grid,ref_grid);
  if (uVar8 == 0) {
    uVar8 = ref_facelift_create(&ref_facelift,freeable_ref_grid,0);
    if (uVar8 == 0) {
      ref_grid->geom->ref_facelift = ref_facelift;
      if (ref_facelift->displacement == (REF_DBL *)0x0) {
        uStack_180 = 1;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x183,"ref_facelift_initialize_edge","requires indirect facelift");
LAB_00197fa6:
        pcVar18 = "init disp";
        uVar14 = 0x1b9;
      }
      else {
        pRVar2 = ref_facelift->grid->geom;
        local_118 = ref_grid;
        for (lVar10 = 0; lVar10 < pRVar2->max; lVar10 = lVar10 + 1) {
          if (pRVar2->descr[lVar10 * 6] == 0) {
            uVar8 = ref_egads_eval(pRVar2,(REF_INT)lVar10,node_xyz,(REF_DBL *)0x0);
            if (uVar8 == 0) {
              iVar15 = pRVar2->descr[lVar10 * 6 + 5];
              RVar20 = -1;
              iVar13 = -1;
              if ((long)iVar15 < 0) goto LAB_00197bf0;
              pRVar3 = pRVar2->ref_adj;
              RVar20 = -1;
              if (pRVar3->nnode <= iVar15) goto LAB_00197bf0;
              iVar15 = pRVar3->first[iVar15];
              RVar20 = -1;
              if (iVar15 == -1) goto LAB_00197bf0;
              pRVar9 = pRVar3->item;
              do {
                RVar20 = pRVar9[iVar15].ref;
                iVar13 = iVar15;
LAB_00197bf0:
                do {
                  if (iVar13 == -1) goto LAB_00197b81;
                  if ((pRVar2->descr[RVar20 * 6] == 1) && (ref_facelift->strong_bc[RVar20] == 0)) {
                    uVar8 = ref_egads_eval(pRVar2,RVar20,local_e8,(REF_DBL *)0x0);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x18d,"ref_facelift_initialize_edge",(ulong)uVar8,"eval face");
                      uStack_180 = (ulong)uVar8;
                      goto LAB_00197fa6;
                    }
                    ref_facelift->strong_bc[RVar20] = 1;
                    pRVar4 = ref_facelift->displacement;
                    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                      pRVar4[RVar20 * 3 + lVar11] = node_xyz[lVar11] - local_e8[lVar11];
                    }
                  }
                  pRVar9 = pRVar2->ref_adj->item;
                  iVar15 = pRVar9[iVar13].next;
                  RVar20 = -1;
                  iVar13 = iVar15;
                } while (iVar15 == -1);
              } while( true );
            }
            uStack_180 = (ulong)uVar8;
            pcVar18 = "eval node";
            uVar14 = 0x188;
            goto LAB_00197f9c;
          }
LAB_00197b81:
        }
        uVar17 = 0;
        uStack_180 = 1;
LAB_00197cf9:
        if ((int)uVar17 != 100) {
          if (ref_facelift->displacement != (REF_DBL *)0x0) goto code_r0x00197d12;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x154,"ref_facelift_solve_edge","requires indirect facelift");
LAB_00197f55:
          pcVar18 = "solve";
          uVar14 = 0x197;
LAB_00197f9c:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar14,"ref_facelift_initialize_edge",uStack_180,pcVar18);
          goto LAB_00197fa6;
        }
        if (ref_facelift->displacement == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x133,"ref_facelift_initialize_face","requires indirect facelift");
          uStack_180 = 1;
LAB_00198491:
          pcVar18 = "init disp";
          uVar14 = 0x1bb;
        }
        else {
          pRVar2 = local_118->geom;
          for (lVar10 = 0; lVar10 < pRVar2->max; lVar10 = lVar10 + 1) {
            if (pRVar2->descr[lVar10 * 6] == 1) {
              uVar8 = ref_egads_eval(pRVar2,(REF_INT)lVar10,node_xyz,(REF_DBL *)0x0);
              if (uVar8 == 0) {
                iVar15 = pRVar2->descr[lVar10 * 6 + 5];
                RVar20 = -1;
                iVar13 = -1;
                if ((long)iVar15 < 0) goto LAB_001980b3;
                pRVar3 = pRVar2->ref_adj;
                RVar20 = -1;
                if (pRVar3->nnode <= iVar15) goto LAB_001980b3;
                iVar15 = pRVar3->first[iVar15];
                RVar20 = -1;
                if (iVar15 == -1) goto LAB_001980b3;
                pRVar9 = pRVar3->item;
                do {
                  RVar20 = pRVar9[iVar15].ref;
                  iVar13 = iVar15;
LAB_001980b3:
                  do {
                    if (iVar13 == -1) goto LAB_0019814f;
                    if ((pRVar2->descr[RVar20 * 6] == 2) && (ref_facelift->strong_bc[RVar20] == 0))
                    {
                      uVar8 = ref_egads_eval(pRVar2,RVar20,local_e8,(REF_DBL *)0x0);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x13d,"ref_facelift_initialize_face",(ulong)uVar8,"eval face");
                        uStack_180 = (ulong)uVar8;
                        goto LAB_00198491;
                      }
                      ref_facelift->strong_bc[RVar20] = 1;
                      pRVar4 = ref_facelift->displacement;
                      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                        pRVar4[RVar20 * 3 + lVar11] = node_xyz[lVar11] - local_e8[lVar11];
                      }
                    }
                    pRVar9 = pRVar2->ref_adj->item;
                    iVar15 = pRVar9[iVar13].next;
                    RVar20 = -1;
                    iVar13 = iVar15;
                  } while (iVar15 == -1);
                } while( true );
              }
              uStack_180 = (ulong)uVar8;
              pcVar18 = "eval edge";
              uVar14 = 0x138;
              goto LAB_00198487;
            }
LAB_0019814f:
          }
          uVar17 = 0;
LAB_001981f5:
          if ((int)uVar17 != 1000) {
            local_120 = uVar17;
            if (ref_facelift->displacement != (REF_DBL *)0x0) goto code_r0x00198210;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x105,"ref_facelift_solve_face","requires indirect facelift");
            uStack_180 = 1;
LAB_00198440:
            pcVar18 = "solve";
            uVar14 = 0x148;
LAB_00198487:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,uVar14,"ref_facelift_initialize_face",uStack_180,pcVar18);
            goto LAB_00198491;
          }
          if (ref_facelift->displacement != (REF_DBL *)0x0) {
            pRVar6 = ref_facelift->grid->node;
            pRVar2 = ref_facelift->grid->geom;
            lVar10 = 0;
            lVar11 = 0;
            lVar21 = 0;
            do {
              if (pRVar2->max <= lVar21) {
                return 0;
              }
              if (*(int *)((long)pRVar2->descr + lVar11) == 2) {
                uVar8 = ref_egads_eval_at(pRVar2,2,*(REF_INT *)((long)pRVar2->descr + lVar11 + 4),
                                          (REF_DBL *)((long)pRVar2->param + lVar10),(REF_DBL *)nodes
                                          ,(REF_DBL *)0x0);
                if (uVar8 != 0) {
                  uStack_180 = (ulong)uVar8;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x1a7,"ref_facelift_apply",(ulong)uVar8,"eval at");
                  goto LAB_00198678;
                }
                pRVar4 = ref_facelift->displacement;
                nodes._0_8_ = *(double *)((long)pRVar4 + lVar11) + (double)nodes._0_8_;
                nodes._8_8_ = *(double *)((long)pRVar4 + lVar11 + 8) + (double)nodes._8_8_;
                nodes._16_8_ = *(double *)((long)pRVar4 + lVar11 + 0x10) + (double)nodes._16_8_;
                pRVar4 = pRVar6->real;
                lVar12 = (long)*(int *)((long)pRVar2->descr + lVar11 + 0x14);
                pRVar4[lVar12 * 0xf] = (REF_DBL)nodes._0_8_;
                pRVar4[lVar12 * 0xf + 1] = (REF_DBL)nodes._8_8_;
                pRVar4[lVar12 * 0xf + 2] = (REF_DBL)nodes._16_8_;
              }
              lVar21 = lVar21 + 1;
              lVar11 = lVar11 + 0x18;
              lVar10 = lVar10 + 0x10;
            } while( true );
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1a2,"ref_facelift_apply","requires indirect facelift");
          uStack_180 = 1;
LAB_00198678:
          pcVar18 = "apply";
          uVar14 = 0x1bc;
        }
      }
    }
    else {
      uStack_180 = (ulong)uVar8;
      pcVar18 = "create";
      uVar14 = 0x1b7;
    }
  }
  else {
    uStack_180 = (ulong)uVar8;
    pcVar18 = "deep copy";
    uVar14 = 0x1b5;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar14
         ,"ref_facelift_attach",uStack_180,pcVar18);
  return (REF_STATUS)uStack_180;
code_r0x00197d12:
  pRVar5 = ref_facelift->edg_cell;
  pRVar2 = ref_facelift->grid->geom;
  local_108 = uVar17;
  for (uVar16 = 0; (long)uVar16 < (long)pRVar2->max; uVar16 = uVar16 + 1) {
    local_150 = uVar16 * 6;
    if ((pRVar2->descr[uVar16 * 6] == 1) && (ref_facelift->strong_bc[uVar16] == 0)) {
      iVar15 = pRVar2->descr[uVar16 * 6 + 5];
      uVar17 = 0xffffffff;
      RVar20 = -1;
      if (-1 < (long)iVar15) {
        pRVar3 = pRVar5->ref_adj;
        uVar17 = 0xffffffff;
        RVar20 = -1;
        if (iVar15 < pRVar3->nnode) {
          uVar8 = pRVar3->first[iVar15];
          uVar17 = 0xffffffff;
          RVar20 = -1;
          if ((long)(int)uVar8 != -1) {
            RVar20 = pRVar3->item[(int)uVar8].ref;
            uVar17 = (ulong)uVar8;
          }
        }
      }
      local_150 = local_150 | 1;
      local_100 = uVar16 * 0x18;
      local_138 = 0.0;
      dStack_130 = 0.0;
      local_148 = 0.0;
      uStack_140 = 0;
      local_168 = 0.0;
      local_120 = uVar16;
      while (uVar16 = local_120, (int)uVar17 != -1) {
        local_110 = uVar17;
        uVar8 = ref_cell_nodes(pRVar5,RVar20,nodes);
        if (uVar8 != 0) {
          pcVar18 = "nodes";
          uVar14 = 0x15f;
LAB_00197f48:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar14,"ref_facelift_solve_edge",(ulong)uVar8,pcVar18);
          uStack_180 = (ulong)uVar8;
          goto LAB_00197f55;
        }
        for (lVar10 = 0; lVar10 < pRVar5->node_per; lVar10 = lVar10 + 1) {
          if (nodes[lVar10] != iVar15) {
            uVar8 = ref_geom_find(pRVar2,nodes[lVar10],1,pRVar2->descr[local_150],&local_154);
            if (uVar8 != 0) {
              pcVar18 = "other geom";
              uVar14 = 0x164;
              goto LAB_00197f48;
            }
            local_168 = local_168 + 0.5;
            local_148 = local_148 + ref_facelift->displacement[(long)local_154 * 3] * 0.5;
            pdVar1 = ref_facelift->displacement + (long)local_154 * 3 + 1;
            local_138 = local_138 + *pdVar1 * 0.5;
            dStack_130 = dStack_130 + pdVar1[1] * 0.5;
          }
        }
        if (0.1 < local_168) {
          pRVar4 = ref_facelift->displacement;
          auVar22._8_8_ = local_138;
          auVar22._0_8_ = local_148;
          auVar23._8_8_ = local_168;
          auVar23._0_8_ = local_168;
          auVar23 = divpd(auVar22,auVar23);
          *(undefined1 (*) [16])((long)pRVar4 + local_100) = auVar23;
          *(double *)((long)pRVar4 + local_100 + 0x10) = dStack_130 / local_168;
        }
        pRVar9 = pRVar5->ref_adj->item;
        uVar17 = (ulong)pRVar9[(int)local_110].next;
        RVar20 = -1;
        if (uVar17 != 0xffffffffffffffff) {
          RVar20 = pRVar9[uVar17].ref;
        }
      }
    }
  }
  uVar17 = (ulong)((int)local_108 + 1);
  goto LAB_00197cf9;
code_r0x00198210:
  pRVar5 = ref_facelift->tri_cell;
  pRVar2 = ref_facelift->grid->geom;
  uVar17 = 0;
  while ((long)uVar17 < (long)pRVar2->max) {
    uVar16 = uVar17;
    if ((pRVar2->descr[uVar17 * 6] == 2) && (ref_facelift->strong_bc[uVar17] == 0)) {
      iVar15 = pRVar2->descr[uVar17 * 6 + 5];
      uVar19 = 0xffffffff;
      RVar20 = -1;
      if (-1 < (long)iVar15) {
        pRVar3 = pRVar5->ref_adj;
        uVar19 = 0xffffffff;
        RVar20 = -1;
        if (iVar15 < pRVar3->nnode) {
          uVar8 = pRVar3->first[iVar15];
          uVar19 = 0xffffffff;
          RVar20 = -1;
          if ((long)(int)uVar8 != -1) {
            RVar20 = pRVar3->item[(int)uVar8].ref;
            uVar19 = (ulong)uVar8;
          }
        }
      }
      local_118 = (REF_GRID)(uVar17 * 0x18);
      local_138 = 0.0;
      dStack_130 = 0.0;
      local_148 = 0.0;
      uStack_140 = 0;
      local_168 = 0.0;
      local_110 = uVar17;
      while (uVar16 = local_110, (int)uVar19 != -1) {
        local_150 = uVar19;
        uVar8 = ref_cell_nodes(pRVar5,RVar20,nodes);
        if (uVar8 != 0) {
          pcVar18 = "nodes";
          uVar14 = 0x110;
LAB_00198436:
          uStack_180 = (ulong)uVar8;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar14,"ref_facelift_solve_face",uStack_180,pcVar18);
          goto LAB_00198440;
        }
        for (lVar10 = 0; lVar10 < pRVar5->node_per; lVar10 = lVar10 + 1) {
          if (nodes[lVar10] != iVar15) {
            uVar8 = ref_geom_find(pRVar2,nodes[lVar10],2,pRVar2->descr[uVar17 * 6 | 1],&local_154);
            if (uVar8 != 0) {
              pcVar18 = "other geom";
              uVar14 = 0x115;
              goto LAB_00198436;
            }
            local_168 = local_168 + 0.5;
            local_148 = local_148 + ref_facelift->displacement[(long)local_154 * 3] * 0.5;
            pdVar1 = ref_facelift->displacement + (long)local_154 * 3 + 1;
            local_138 = local_138 + *pdVar1 * 0.5;
            dStack_130 = dStack_130 + pdVar1[1] * 0.5;
          }
        }
        if (0.1 < local_168) {
          pRVar4 = ref_facelift->displacement;
          auVar24._8_8_ = local_138;
          auVar24._0_8_ = local_148;
          auVar7._8_8_ = local_168;
          auVar7._0_8_ = local_168;
          auVar23 = divpd(auVar24,auVar7);
          *(undefined1 (*) [16])((long)pRVar4 + (long)local_118) = auVar23;
          *(double *)((long)(pRVar4 + 2) + (long)local_118) = dStack_130 / local_168;
        }
        pRVar9 = pRVar5->ref_adj->item;
        uVar19 = (ulong)pRVar9[(int)local_150].next;
        RVar20 = -1;
        if (uVar19 != 0xffffffffffffffff) {
          RVar20 = pRVar9[uVar19].ref;
        }
      }
    }
    uVar17 = uVar16 + 1;
  }
  uVar17 = (ulong)((int)local_120 + 1);
  goto LAB_001981f5;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_attach(REF_GRID ref_grid) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  RSS(ref_grid_deep_copy(&freeable_ref_grid, ref_grid), "deep copy");
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_initialize_edge(ref_facelift), "init disp");
  RSS(ref_facelift_initialize_face(ref_facelift, ref_grid_geom(ref_grid)),
      "init disp");
  RSS(ref_facelift_apply(ref_facelift), "apply");
  return REF_SUCCESS;
}